

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompressLegacy.c
# Opt level: O1

void GetNextMatch(void)

{
  UINT8 UVar1;
  int iVar2;
  int iVar3;
  UINT8 *pUVar4;
  NODE_conflict *pNVar5;
  NODE_conflict *pNVar6;
  NODE_conflict *pNVar7;
  NODE_conflict *pNVar8;
  INT32 IVar9;
  uint uVar10;
  long lVar11;
  NODE_conflict NVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  
  pUVar4 = mText;
  mRemainder = mRemainder + -1;
  mPos = mPos + 1;
  if (mPos == 0x100000) {
    memmove(mText,mText + 0x80000,0x80100);
    IVar9 = FreadCrc(pUVar4 + 0x80100,0x80000);
    mRemainder = mRemainder + IVar9;
    mPos = 0x80000;
  }
  NVar12 = mPos;
  pNVar8 = mNext;
  pNVar7 = mPrev;
  pNVar6 = mParent;
  lVar13 = (long)mPos;
  if (mParent[lVar13] != 0) {
    iVar2 = mPrev[lVar13];
    iVar16 = mNext[lVar13];
    mNext[iVar2] = iVar16;
    pNVar7[iVar16] = iVar2;
    iVar2 = pNVar6[lVar13];
    lVar11 = (long)iVar2;
    pNVar6[lVar13] = 0;
    if ((lVar11 < 0x80000) &&
       (UVar1 = mChildCount[lVar11], mChildCount[lVar11] = UVar1 - 1, pNVar5 = mPosition,
       (byte)(UVar1 - 1) < 2)) {
      uVar15 = mPosition[lVar11] & 0x7fffffff;
      uVar14 = uVar15 - 0x80000;
      if ((int)uVar15 < NVar12) {
        uVar14 = uVar15;
      }
      lVar13 = (long)pNVar6[lVar11];
      uVar15 = mPosition[lVar13];
      uVar17 = uVar14;
      while( true ) {
        iVar16 = (int)lVar13;
        if (-1 < (int)uVar15) break;
        uVar15 = uVar15 & 0x7fffffff;
        uVar10 = uVar15 - 0x80000;
        if ((int)uVar15 < NVar12) {
          uVar10 = uVar15;
        }
        if ((int)uVar17 < (int)uVar10) {
          uVar17 = uVar10;
        }
        pNVar5[iVar16] = uVar17 | 0x80000;
        lVar13 = (long)pNVar6[iVar16];
        uVar15 = pNVar5[lVar13];
      }
      if (iVar16 < 0x80000) {
        uVar10 = uVar15 - 0x80000;
        if ((int)uVar15 < NVar12) {
          uVar10 = uVar15;
        }
        if ((int)uVar10 <= (int)uVar17) {
          uVar10 = uVar17;
        }
        pNVar5[iVar16] = uVar10 | 0x80080000;
      }
      NVar12 = pNVar8[(uint)mText[(long)(int)uVar14 + (ulong)mLevel[lVar11]] * 0x400 + iVar2 +
                      0x100000];
      *pNVar6 = iVar2;
      for (; pNVar6[NVar12] != iVar2; NVar12 = pNVar8[NVar12]) {
      }
      iVar16 = pNVar7[NVar12];
      iVar3 = pNVar8[NVar12];
      pNVar8[iVar16] = iVar3;
      pNVar7[iVar3] = iVar16;
      iVar16 = pNVar7[lVar11];
      pNVar8[iVar16] = NVar12;
      pNVar7[NVar12] = iVar16;
      iVar16 = pNVar8[lVar11];
      pNVar7[iVar16] = NVar12;
      pNVar8[NVar12] = iVar16;
      pNVar6[NVar12] = pNVar6[lVar11];
      pNVar6[lVar11] = 0;
      pNVar8[lVar11] = mAvail;
      mAvail = iVar2;
    }
  }
  InsertNode();
  return;
}

Assistant:

STATIC
  VOID
  GetNextMatch (
  VOID
  )
  /*++

  Routine Description:

  Advance the current position (read new data if needed).
  Delete outdated string info. Find a match string for current position.

  Arguments: (VOID)

  Returns: (VOID)

  --*/
{
  INT32 Number;

  mRemainder--;
  mPos++;
  if (mPos == WNDSIZ * 2) {
    memmove (&mText[0], &mText[WNDSIZ], WNDSIZ + MAXMATCH);
    Number = FreadCrc (&mText[WNDSIZ + MAXMATCH], WNDSIZ);
    mRemainder += Number;
    mPos = WNDSIZ;
  }

  DeleteNode ();
  InsertNode ();
}